

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prolog.cpp
# Opt level: O3

void __thiscall Clause::print(Clause *this)

{
  (*(this->head->super_Term)._vptr_Term[3])();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," :- ",4);
  if (this->body != (Goal *)0x0) {
    Goal::print(this->body);
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"true",4);
  return;
}

Assistant:

void print() const
    {
        head->print();
        std::cout << " :- ";
        if (body)
            body->print();
        else
            std::cout << "true";
    }